

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O3

void __thiscall mocker::ir::Builder::translateLogicBinary(Builder *this,BinaryExpr *node)

{
  bool bVar1;
  _List_node_base *p_Var2;
  FunctionModule *this_00;
  BuilderContext *hint;
  size_type sVar3;
  element_type *peVar4;
  BBLIter BVar5;
  BBLIter BVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  BuilderContext *pBVar8;
  shared_ptr<mocker::ir::Jump> jumpSucc;
  shared_ptr<mocker::ir::Reg> boolExpAddr;
  shared_ptr<mocker::ir::Reg> val;
  shared_ptr<mocker::ir::Label> succLabel;
  Defer undo;
  undefined1 local_169;
  undefined1 local_168 [16];
  undefined1 local_158 [24];
  Jump *local_140;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_138;
  undefined1 local_130 [24];
  shared_ptr<mocker::ir::IntLiteral> local_118;
  undefined1 local_108 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f0;
  BBLIter local_e8;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  shared_ptr<mocker::ir::IRInst> local_d8;
  shared_ptr<mocker::ir::IRInst> local_c8;
  shared_ptr<mocker::ir::Addr> local_b8;
  _List_node_base *local_a8;
  BBLIter local_a0;
  shared_ptr<mocker::ir::IRInst> local_98;
  shared_ptr<mocker::ir::IRInst> local_88;
  shared_ptr<mocker::ir::IRInst> local_78;
  shared_ptr<mocker::ir::IRInst> local_68;
  _Any_data local_58;
  _Map_pointer local_48;
  _Elt_pointer psStack_40;
  
  if ((this->ctx->logicalExprInfo).inCondition == false) {
    translateEscapedLogicBinary(this,node);
    return;
  }
  BVar5 = BuilderContext::getCurBasicBlock(this->ctx);
  p_Var2 = BVar5._M_node[1]._M_next;
  local_130._16_8_ = operator_new(0x20);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._16_8_)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._16_8_)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._16_8_)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_001e8af0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_130._16_8_ + 0x10))->
  _vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001e8b68;
  *(_List_node_base **)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_130._16_8_ + 0x10))->_M_use_count =
       p_Var2;
  this_00 = this->ctx->curFunc;
  local_a0 = FunctionModule::pushBackBB(this_00);
  hint = this->ctx;
  local_48 = (_Map_pointer)0x0;
  psStack_40 = (_Elt_pointer)0x0;
  local_58._M_unused._M_object = (_Elt_pointer)0x0;
  local_58._8_8_ = (_Elt_pointer)0x0;
  pBVar8 = hint;
  if (((hint->logicalExprInfo).empty == true) &&
     ((hint->logicalExprInfo).empty = false, (hint->logicalExprInfo).inCondition == false)) {
    local_168._0_8_ = local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"boolExpAddr","");
    BuilderContext::makeTempLocalReg((BuilderContext *)local_130,(string *)hint);
    local_a8 = BVar5._M_node;
    if ((Load *)local_168._0_8_ != (Load *)local_158) {
      operator_delete((void *)local_168._0_8_,(ulong)(local_158._0_8_ + 1));
    }
    pBVar8 = this->ctx;
    BVar5._M_node =
         (this_00->bbs).
         super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>._M_impl.
         _M_node.super__List_node_base._M_next;
    local_168._0_8_ = (Load *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mocker::ir::Alloca,std::allocator<mocker::ir::Alloca>,std::shared_ptr<mocker::ir::Reg>&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168 + 8),(Alloca **)local_168,
               (allocator<mocker::ir::Alloca> *)(local_108 + 0x10),
               (shared_ptr<mocker::ir::Reg> *)local_130);
    local_68.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_168._0_8_;
    local_68.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_;
    local_168._0_8_ = (Load *)0x0;
    local_168._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    BuilderContext::appendInstFront(pBVar8,BVar5,&local_68);
    if (local_68.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
    }
    local_e8 = FunctionModule::pushBackBB(this_00);
    p_Var2 = local_e8._M_node[1]._M_next;
    local_f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
    local_f0->_M_use_count = 1;
    local_f0->_M_weak_count = 1;
    local_f0->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001e8af0;
    local_108._16_8_ = local_f0 + 1;
    local_f0[1]._vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001e8b68;
    *(_List_node_base **)&local_f0[1]._M_use_count = p_Var2;
    pBVar8 = this->ctx;
    local_168._0_8_ = local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"v","");
    BuilderContext::makeTempLocalReg((BuilderContext *)local_108,(string *)pBVar8);
    if ((Load *)local_168._0_8_ != (Load *)local_158) {
      operator_delete((void *)local_168._0_8_,(ulong)(local_158._0_8_ + 1));
    }
    pBVar8 = this->ctx;
    local_168._0_8_ = (Load *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mocker::ir::Load,std::allocator<mocker::ir::Load>,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168 + 8),(Load **)local_168,
               (allocator<mocker::ir::Load> *)&local_140,(shared_ptr<mocker::ir::Reg> *)local_108,
               (shared_ptr<mocker::ir::Reg> *)local_130);
    local_78.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_168._0_8_;
    local_78.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_;
    local_168._0_8_ = (Load *)0x0;
    local_168._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    BuilderContext::appendInst(pBVar8,local_e8,&local_78);
    if (local_78.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
    }
    pBVar8 = this->ctx;
    local_b8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_108._0_8_;
    local_b8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(local_108._8_8_ + 8) = *(int *)(local_108._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(local_108._8_8_ + 8) = *(int *)(local_108._8_8_ + 8) + 1;
      }
    }
    BuilderContext::setExprAddr(pBVar8,(NodeID)node,&local_b8);
    if (local_b8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_140 = (Jump *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mocker::ir::Jump,std::allocator<mocker::ir::Jump>,std::shared_ptr<mocker::ir::Label>&>
              (&local_138,&local_140,(allocator<mocker::ir::Jump> *)local_168,
               (shared_ptr<mocker::ir::Label> *)(local_108 + 0x10));
    BVar5 = FunctionModule::pushBackBB(this_00);
    (hint->logicalExprInfo).trueNext._M_node = BVar5._M_node;
    pBVar8 = this->ctx;
    local_118.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
    (local_118.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi)->_M_use_count = 1;
    (local_118.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi)->_M_weak_count = 1;
    (local_118.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001e9d60;
    local_118.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (local_118.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi + 1);
    local_118.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001e9db0;
    local_118.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi[1]._M_use_count = 1;
    local_118.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi[1]._M_weak_count = 0;
    local_168._0_8_ = (Load *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mocker::ir::Store,std::allocator<mocker::ir::Store>,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::IntLiteral>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168 + 8),(Store **)local_168,
               (allocator<mocker::ir::Store> *)&local_169,(shared_ptr<mocker::ir::Reg> *)local_130,
               &local_118);
    local_88.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_168._0_8_;
    local_88.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_;
    local_168._0_8_ = (Load *)0x0;
    local_168._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    BuilderContext::appendInst(pBVar8,BVar5,&local_88);
    BVar5._M_node = local_a8;
    if (local_88.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
    }
    if (local_118.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_118.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    pBVar8 = this->ctx;
    BVar6._M_node = (hint->logicalExprInfo).trueNext._M_node;
    local_c8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_140->super_IRInst;
    local_c8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_138._M_pi;
    if (local_138._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_138._M_pi)->_M_use_count = (local_138._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_138._M_pi)->_M_use_count = (local_138._M_pi)->_M_use_count + 1;
      }
    }
    BuilderContext::appendInst(pBVar8,BVar6,&local_c8);
    if (local_c8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    BVar6 = FunctionModule::pushBackBB(this_00);
    *(_List_node_base **)&(hint->logicalExprInfo).falseNext = BVar6._M_node;
    pBVar8 = this->ctx;
    local_118.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
    (local_118.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi)->_M_use_count = 1;
    (local_118.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi)->_M_weak_count = 1;
    (local_118.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001e9d60;
    local_118.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (local_118.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi + 1);
    local_118.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001e9db0;
    local_118.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi[1]._M_use_count = 0;
    local_118.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi[1]._M_weak_count = 0;
    local_168._0_8_ = (Load *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mocker::ir::Store,std::allocator<mocker::ir::Store>,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::IntLiteral>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168 + 8),(Store **)local_168,
               (allocator<mocker::ir::Store> *)&local_169,(shared_ptr<mocker::ir::Reg> *)local_130,
               &local_118);
    local_98.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_168._0_8_;
    local_98.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_;
    local_168._0_8_ = (Load *)0x0;
    local_168._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    BuilderContext::appendInst(pBVar8,BVar6,&local_98);
    if (local_98.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
    }
    if (local_118.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_118.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    pBVar8 = this->ctx;
    BVar6._M_node =
         (_List_node_base *)
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)&(hint->logicalExprInfo).falseNext)->_M_allocated_capacity;
    local_d8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_140->super_IRInst;
    local_d8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_138._M_pi;
    if (local_138._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_138._M_pi)->_M_use_count = (local_138._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_138._M_pi)->_M_use_count = (local_138._M_pi)->_M_use_count + 1;
      }
    }
    BuilderContext::appendInst(pBVar8,BVar6,&local_d8);
    if (local_d8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_158._8_8_ =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/ir_builder/builder.cpp:592:18)>
         ::_M_invoke;
    local_168._8_8_ = local_e8._M_node;
    local_158._0_8_ =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/ir_builder/builder.cpp:592:18)>
         ::_M_manager;
    local_168._0_8_ = this;
    Defer::operator=((Defer *)&local_58,(Defer *)local_168);
    Defer::~Defer((Defer *)local_168);
    if (local_138._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_138._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
    }
    if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._8_8_);
    }
    pBVar8 = this->ctx;
  }
  BuilderContext::setCurBasicBlock(pBVar8,BVar5);
  BVar5._M_node = local_a0._M_node;
  local_e8._M_node = *(_List_node_base **)&hint->logicalExprInfo;
  uStack_e0 = *(undefined4 *)&(hint->logicalExprInfo).trueNext._M_node;
  uStack_dc = *(undefined4 *)((long)&(hint->logicalExprInfo).trueNext._M_node + 4);
  sVar3 = ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)&(hint->logicalExprInfo).falseNext)->_M_allocated_capacity;
  bVar1 = (hint->logicalExprInfo).inCondition;
  if (node->op == LogicalOr) {
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&(hint->logicalExprInfo).falseNext;
  }
  else {
    if (node->op != LogicalAnd) goto LAB_0013d0ee;
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&(hint->logicalExprInfo).trueNext;
  }
  *(_List_node_base **)paVar7 = local_a0._M_node;
LAB_0013d0ee:
  peVar4 = (node->lhs).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*(peVar4->super_ASTNode)._vptr_ASTNode[3])
            (peVar4,&this->field_0x0 + *(long *)(*(long *)this + -0xf0));
  *(_List_node_base **)&hint->logicalExprInfo = local_e8._M_node;
  (hint->logicalExprInfo).trueNext._M_node = (_List_node_base *)CONCAT44(uStack_dc,uStack_e0);
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)&(hint->logicalExprInfo).falseNext)->_M_allocated_capacity = sVar3;
  (hint->logicalExprInfo).inCondition = bVar1;
  BuilderContext::setCurBasicBlock(this->ctx,BVar5);
  peVar4 = (node->rhs).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*(peVar4->super_ASTNode)._vptr_ASTNode[3])
            (peVar4,&this->field_0x0 + *(long *)(*(long *)this + -0xf0));
  Defer::~Defer((Defer *)&local_58);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._16_8_);
  return;
}

Assistant:

void Builder::translateLogicBinary(const ast::BinaryExpr &node) const {
  if (!ctx.getLogicalExprInfo().inCondition) {
    translateEscapedLogicBinary(node);
    return;
  }

  auto originBB = ctx.getCurBasicBlock();
  auto originLabel = getBBLabel(originBB);
  FunctionModule &func = ctx.getCurFunc();
  auto lhsFirstBB = originBB;
  auto rhsFirstBB = func.pushBackBB();
  auto &info = ctx.getLogicalExprInfo();

  Defer undo;
  while (info.empty) {
    info.empty = false;

    if (info.inCondition)
      break;

    auto boolExpAddr = ctx.makeTempLocalReg("boolExpAddr");
    ctx.appendInstFront(func.getFirstBB(),
                        std::make_shared<Alloca>(boolExpAddr));

    auto succBB = func.pushBackBB();
    auto succLabel = getBBLabel(succBB);
    auto val = ctx.makeTempLocalReg("v");
    ctx.appendInst(succBB, std::make_shared<Load>(val, boolExpAddr));
    ctx.setExprAddr(node.getID(), val);

    auto jumpSucc = std::make_shared<Jump>(succLabel);
    info.trueNext = func.pushBackBB();
    ctx.appendInst(
        info.trueNext,
        std::make_shared<Store>(boolExpAddr, std::make_shared<IntLiteral>(1)));
    ctx.appendInst(info.trueNext, jumpSucc);
    info.falseNext = func.pushBackBB();
    ctx.appendInst(
        info.falseNext,
        std::make_shared<Store>(boolExpAddr, std::make_shared<IntLiteral>(0)));
    ctx.appendInst(info.falseNext, jumpSucc);

    undo = Defer([this, succBB] {
      ctx.getLogicalExprInfo().empty = true;
      ctx.setCurBasicBlock(succBB);
    });

    break;
  }

  ctx.setCurBasicBlock(lhsFirstBB);
  auto infoBak = info;
  if (node.op == ast::BinaryExpr::LogicalOr) {
    info.trueNext = infoBak.trueNext;
    info.falseNext = rhsFirstBB;
  } else if (node.op == ast::BinaryExpr::LogicalAnd) {
    info.trueNext = rhsFirstBB;
    info.falseNext = infoBak.falseNext;
  }
  visit(*node.lhs);
  info = infoBak;

  ctx.setCurBasicBlock(rhsFirstBB);
  visit(*node.rhs);
}